

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

bool __thiscall google::protobuf::EnumDescriptorProto::IsInitialized(EnumDescriptorProto *this)

{
  uint uVar1;
  bool bVar2;
  LogMessage *other;
  EnumOptions *pEVar3;
  LogMessage local_58;
  LogFinisher local_19;
  
  bVar2 = internal::AllAreInitialized<google::protobuf::EnumValueDescriptorProto>(&this->value_);
  if (bVar2) {
    uVar1 = (this->_has_bits_).has_bits_[0];
    pEVar3 = this->options_;
    if ((pEVar3 == (EnumOptions *)0x0 & (byte)uVar1 >> 1) == 1) {
      internal::LogMessage::LogMessage
                (&local_58,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O3/src/src/google/protobuf/descriptor.pb.h"
                 ,0x2548);
      other = internal::LogMessage::operator<<
                        (&local_58,"CHECK failed: !value || options_ != nullptr: ");
      internal::LogFinisher::operator=(&local_19,other);
      internal::LogMessage::~LogMessage(&local_58);
      pEVar3 = this->options_;
    }
    else if ((uVar1 & 2) == 0) {
      return true;
    }
    bVar2 = internal::ExtensionSet::IsInitialized(&pEVar3->_extensions_);
    if ((bVar2) &&
       (bVar2 = internal::AllAreInitialized<google::protobuf::UninterpretedOption>
                          (&pEVar3->uninterpreted_option_), bVar2)) {
      return true;
    }
  }
  return false;
}

Assistant:

bool EnumDescriptorProto::IsInitialized() const {
  if (!::PROTOBUF_NAMESPACE_ID::internal::AllAreInitialized(value_)) return false;
  if (_internal_has_options()) {
    if (!options_->IsInitialized()) return false;
  }
  return true;
}